

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O2

void set_cmninit(feat_t *fcb,char *cmninit)

{
  char *ptr;
  char *pcVar1;
  char *__s;
  long lVar2;
  cmn_t *pcVar3;
  double dVar4;
  
  if ((cmninit == (char *)0x0) || (fcb->cmn_struct == (cmn_t *)0x0)) {
    return;
  }
  ptr = __ckd_salloc__(cmninit,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                       ,0x1a4);
  pcVar3 = fcb->cmn_struct;
  lVar2 = 0;
  __s = ptr;
  do {
    if (pcVar3->veclen <= lVar2) {
LAB_0010ff93:
      ckd_free(ptr);
      return;
    }
    pcVar1 = strchr(__s,0x2c);
    if (pcVar1 == (char *)0x0) {
      if (*__s != '\0') {
        dVar4 = atof(__s);
        pcVar3->cmn_mean[lVar2] = (mfcc_t)(float)dVar4;
      }
      goto LAB_0010ff93;
    }
    *pcVar1 = '\0';
    dVar4 = atof(__s);
    pcVar3 = fcb->cmn_struct;
    pcVar3->cmn_mean[lVar2] = (mfcc_t)(float)dVar4;
    __s = pcVar1 + 1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void
set_cmninit(feat_t *fcb, char const *cmninit)
{
    char *c, *cc, *vallist;
    int32 nvals;

    if (cmninit == NULL)
        return;
    if (fcb->cmn_struct == NULL)
	return;
    vallist = ckd_salloc(cmninit);
    c = vallist;
    nvals = 0;
    while (nvals < fcb->cmn_struct->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
        c = cc + 1;
        ++nvals;
    }
    if (nvals < fcb->cmn_struct->veclen && *c != '\0') {
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
    }
    ckd_free(vallist);
}